

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O3

FilenameBuilder * __thiscall
GOESRProduct::getFilenameBuilder
          (FilenameBuilder *__return_storage_ptr__,GOESRProduct *this,Handler *config)

{
  long lVar1;
  __syscall_slong_t _Var2;
  AnnotationHeader AStack_68;
  string local_40;
  
  (__return_storage_ptr__->dir)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->dir).field_2;
  (__return_storage_ptr__->dir)._M_string_length = 0;
  (__return_storage_ptr__->dir).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->time).tv_sec = 0;
  (__return_storage_ptr__->time).tv_nsec = 0;
  (__return_storage_ptr__->awips).t1t2._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).t1t2.field_2;
  (__return_storage_ptr__->awips).t1t2._M_string_length = 0;
  (__return_storage_ptr__->awips).t1t2.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).a1a2._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).a1a2.field_2;
  (__return_storage_ptr__->awips).a1a2._M_string_length = 0;
  (__return_storage_ptr__->awips).a1a2.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).ii._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).ii.field_2;
  (__return_storage_ptr__->awips).ii._M_string_length = 0;
  (__return_storage_ptr__->awips).ii.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).cccc._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).cccc.field_2;
  (__return_storage_ptr__->awips).cccc._M_string_length = 0;
  (__return_storage_ptr__->awips).cccc.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).yy._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).yy.field_2;
  (__return_storage_ptr__->awips).yy._M_string_length = 0;
  (__return_storage_ptr__->awips).yy.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).gggg._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).gggg.field_2;
  (__return_storage_ptr__->awips).gggg._M_string_length = 0;
  (__return_storage_ptr__->awips).gggg.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).bbb._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).bbb.field_2;
  (__return_storage_ptr__->awips).bbb._M_string_length = 0;
  (__return_storage_ptr__->awips).bbb.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).nnn._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).nnn.field_2;
  (__return_storage_ptr__->awips).nnn._M_string_length = 0;
  (__return_storage_ptr__->awips).nnn.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).xxx._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).xxx.field_2;
  (__return_storage_ptr__->awips).xxx._M_string_length = 0;
  (__return_storage_ptr__->awips).xxx.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->awips).qq._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->awips).qq.field_2;
  (__return_storage_ptr__->awips).qq._M_string_length = 0;
  (__return_storage_ptr__->awips).qq.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->product).nameShort._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->product).nameShort.field_2;
  (__return_storage_ptr__->product).nameShort._M_string_length = 0;
  (__return_storage_ptr__->product).nameShort.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->product).nameLong._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->product).nameLong.field_2;
  (__return_storage_ptr__->product).nameLong._M_string_length = 0;
  (__return_storage_ptr__->product).nameLong.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->region).nameShort._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->region).nameShort.field_2;
  (__return_storage_ptr__->region).nameShort._M_string_length = 0;
  (__return_storage_ptr__->region).nameShort.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->region).nameLong._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->region).nameLong.field_2;
  (__return_storage_ptr__->region).nameLong._M_string_length = 0;
  (__return_storage_ptr__->region).nameLong.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->channel).nameShort._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->channel).nameShort.field_2;
  (__return_storage_ptr__->channel).nameShort._M_string_length = 0;
  (__return_storage_ptr__->channel).nameShort.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->channel).nameLong._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->channel).nameLong.field_2;
  (__return_storage_ptr__->channel).nameLong._M_string_length = 0;
  (__return_storage_ptr__->channel).nameLong.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  lVar1 = (long)(((this->files_).
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lrit::getHeader<lrit::AnnotationHeader>
            (&AStack_68,(Buffer *)(lVar1 + 0x38),(HeaderMap *)(lVar1 + 0x50));
  removeSuffix(&local_40,&AStack_68.text);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->filename,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_68.text._M_dataplus._M_p != &AStack_68.text.field_2) {
    operator_delete(AStack_68.text._M_dataplus._M_p,AStack_68.text.field_2._M_allocated_capacity + 1
                   );
  }
  _Var2 = (this->frameStart_).tv_nsec;
  (__return_storage_ptr__->time).tv_sec = (this->frameStart_).tv_sec;
  (__return_storage_ptr__->time).tv_nsec = _Var2;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->product);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->product).nameLong);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->region);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->region).nameLong);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->channel);
  std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->channel).nameLong);
  return __return_storage_ptr__;
}

Assistant:

FilenameBuilder GOESRProduct::getFilenameBuilder(const Config::Handler& config) const {
  FilenameBuilder fb;
  fb.dir = config.dir;
  fb.filename = removeSuffix(getHeader<lrit::AnnotationHeader>().text);
  fb.time = frameStart_;
  fb.product = product_;
  fb.region = region_;
  fb.channel = channel_;
  return fb;
}